

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xpath.c
# Opt level: O3

uint16_t parse_ncname(ly_ctx *ctx,char *ncname)

{
  uint uVar1;
  uint uVar2;
  ulong uVar3;
  uint16_t uVar4;
  uint local_2c [2];
  uint size;
  
  uVar1 = lyxml_getutf8(ctx,ncname,local_2c);
  if (uVar1 == 0x5f || uVar1 - 0x61 < 0x1a) {
LAB_00172f7a:
    uVar3 = (ulong)(local_2c[0] & 0xffff);
    uVar4 = (uint16_t)local_2c[0];
    if (ncname[uVar3] != '\0') {
      uVar1 = local_2c[0];
      do {
        uVar2 = lyxml_getutf8(ctx,ncname + uVar3,local_2c);
        if (((0x19 < uVar2 - 0x61) && (uVar2 != 0x2d)) && (uVar2 != 0x5f)) {
          if (uVar2 - 0x30 < 0xb || uVar2 - 0x41 < 0x1a) {
LAB_00172fd2:
            if (uVar2 == 0x3a) {
              return (uint16_t)uVar1;
            }
          }
          else if (((uVar2 != 0x2e) && (uVar2 != 0xb7)) &&
                  (uVar2 == 0x37e || 0x1c8f < uVar2 - 0x370)) {
            if ((((uVar2 - 0xfdf0 < 0x20e) || (uVar2 - 0xf900 < 0x4d0)) ||
                ((uVar2 - 0x3001 < 0xa7ff || ((uVar2 - 0x2c00 < 0x3f0 || (uVar2 - 0x2070 < 0x120))))
                )) || ((uVar2 - 0x300 < 0x70 ||
                       (((uVar2 & 0xfffffffe) == 0x200c ||
                        (uVar2 - 0xc0 < 0x240 && (uVar2 & 0xffffffdf) != 0xd7))))))
            goto LAB_00172fd2;
            if (0xdffff < uVar2 - 0x10000) {
              return (uint16_t)uVar1;
            }
          }
        }
        uVar1 = uVar1 + local_2c[0];
        uVar4 = (uint16_t)uVar1;
        uVar3 = (ulong)(uVar1 & 0xffff);
      } while (ncname[uVar3] != '\0');
    }
  }
  else {
    if (uVar1 == 0x3a || uVar1 - 0x41 < 0x1a) {
LAB_00172eb6:
      if (uVar1 != 0x3a) goto LAB_00172f7a;
    }
    else {
      if (uVar1 != 0x37e && uVar1 - 0x370 < 0x1c90) goto LAB_00172f7a;
      if (((((uVar1 - 0xfdf0 < 0x20e) || (uVar1 - 0xf900 < 0x4d0)) || (uVar1 - 0x3001 < 0xa7ff)) ||
          ((uVar1 - 0x2c00 < 0x3f0 || (uVar1 - 0x2070 < 0x120)))) ||
         (((uVar1 & 0xfffffffe) == 0x200c || (uVar1 - 0xc0 < 0x240 && (uVar1 & 0xffffffdf) != 0xd7))
         )) goto LAB_00172eb6;
      if (0xfff1ffff < uVar1 - 0xf0000) goto LAB_00172f7a;
    }
    uVar4 = 0;
  }
  return uVar4;
}

Assistant:

static uint16_t
parse_ncname(struct ly_ctx *ctx, const char *ncname)
{
    uint16_t parsed = 0;
    int uc;
    unsigned int size;

    uc = lyxml_getutf8(ctx, &ncname[parsed], &size);
    if (!is_xmlnamestartchar(uc) || (uc == ':')) {
       return parsed;
    }

    do {
        parsed += size;
        if (!ncname[parsed]) {
            break;
        }
        uc = lyxml_getutf8(ctx, &ncname[parsed], &size);
    } while (is_xmlnamechar(uc) && (uc != ':'));

    return parsed;
}